

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_rawset(lua_State *L)

{
  TValue *pTVar1;
  long in_RDI;
  int in_stack_0000000c;
  lua_State *in_stack_00000010;
  
  lj_lib_checktab(L,(int)((ulong)in_RDI >> 0x20));
  lj_lib_checkany(L,(int)((ulong)in_RDI >> 0x20));
  pTVar1 = lj_lib_checkany(L,(int)((ulong)in_RDI >> 0x20));
  *(TValue **)(in_RDI + 0x18) = pTVar1 + 1;
  lua_rawset(in_stack_00000010,in_stack_0000000c);
  return 1;
}

Assistant:

LJLIB_CF(rawset)		LJLIB_REC(.)
{
  lj_lib_checktab(L, 1);
  lj_lib_checkany(L, 2);
  L->top = 1+lj_lib_checkany(L, 3);
  lua_rawset(L, 1);
  return 1;
}